

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O2

Persistence_landscape * __thiscall
Gudhi::Persistence_representations::Persistence_landscape::operator*=
          (Persistence_landscape *__return_storage_ptr__,Persistence_landscape *this,double x)

{
  Persistence_landscape local_40;
  
  multiply_lanscape_by_real_number_not_overwrite(&local_40,this,x);
  operator=(this,&local_40);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::~vector(&local_40.land);
  Persistence_landscape(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Persistence_landscape operator*=(double x) {
    *this = *this * x;
    return *this;
  }